

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O0

BreakpointProbe * __thiscall
Js::DebugDocument::SetBreakPoint_TTDWbpId
          (DebugDocument *this,int64 bpId,StatementLocation statement)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  BreakpointProbe *this_00;
  DebugContext *this_01;
  ProbeContainer *this_02;
  BreakpointProbeList *this_03;
  BreakpointProbeList *pBreakpointList;
  TrackAllocData local_50;
  BreakpointProbe *local_28;
  BreakpointProbe *pProbe;
  ScriptContext *scriptContext;
  int64 bpId_local;
  DebugDocument *this_local;
  
  scriptContext = (ScriptContext *)bpId;
  bpId_local = (int64)this;
  pProbe = (BreakpointProbe *)Utf8SourceInfo::GetScriptContext(this->utf8SourceInfo);
  pAVar1 = &ScriptContext::AllocatorForDiagnostics((ScriptContext *)pProbe)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&BreakpointProbe::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugDocument.cpp"
             ,0xa7);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_50);
  this_00 = (BreakpointProbe *)new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar1,0x3f67b0);
  BreakpointProbe::BreakpointProbe(this_00,this,&statement,(int)scriptContext);
  local_28 = this_00;
  this_01 = ScriptContext::GetDebugContext((ScriptContext *)pProbe);
  this_02 = DebugContext::GetProbeContainer(this_01);
  Js::ProbeContainer::AddProbe(this_02,&local_28->super_Probe);
  this_03 = GetBreakpointList(this);
  JsUtil::
  List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add(this_03,&local_28);
  return local_28;
}

Assistant:

BreakpointProbe* DebugDocument::SetBreakPoint_TTDWbpId(int64 bpId, StatementLocation statement)
    {
        ScriptContext* scriptContext = this->utf8SourceInfo->GetScriptContext();
        BreakpointProbe* pProbe = Anew(scriptContext->AllocatorForDiagnostics(), BreakpointProbe, this, statement, (uint32)bpId);

        scriptContext->GetDebugContext()->GetProbeContainer()->AddProbe(pProbe);
        BreakpointProbeList* pBreakpointList = this->GetBreakpointList();
        pBreakpointList->Add(pProbe);
        return pProbe;
    }